

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aes.c
# Opt level: O0

EVP_CIPHER * EVP_aes_192_cfb128(void)

{
  EVP_CIPHER *pEVar1;
  
  pEVar1 = &aes_192_cfb;
  if ((DAT_005e9d1c & 0x2000000) != 0) {
    pEVar1 = &aesni_192_cfb;
  }
  return (EVP_CIPHER *)pEVar1;
}

Assistant:

static int aes_gcm_cleanup(EVP_CIPHER_CTX *c)
{
    EVP_AES_GCM_CTX *gctx = EVP_C_DATA(EVP_AES_GCM_CTX,c);
    if (gctx == NULL)
        return 0;
    OPENSSL_cleanse(&gctx->gcm, sizeof(gctx->gcm));
    if (gctx->iv != c->iv)
        OPENSSL_free(gctx->iv);
    return 1;
}